

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags,float row_min_height)

{
  ImGuiTable *table;
  ImGuiContext *pIVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  pIVar1 = GImGui;
  table = GImGui->CurrentTable;
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  if (table->IsInsideRow == true) {
    TableEndRow(table);
  }
  *(uint *)&table->field_0x94 = row_flags & 0xffffU | *(int *)&table->field_0x94 << 0x10;
  table->RowCellPaddingY = (pIVar1->Style).CellPadding.y;
  table->RowMinHeight = row_min_height;
  TableBeginRow(table);
  fVar3 = table->RowCellPaddingY + table->RowCellPaddingY + table->RowPosY2;
  fVar4 = row_min_height + table->RowPosY1;
  uVar2 = -(uint)(fVar4 <= fVar3);
  table->RowPosY2 = (float)(~uVar2 & (uint)fVar4 | (uint)fVar3 & uVar2);
  table->InnerWindow->SkipItems = true;
  return;
}

Assistant:

void ImGui::TableNextRow(ImGuiTableRowFlags row_flags, float row_min_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);
    if (table->IsInsideRow)
        TableEndRow(table);

    table->LastRowFlags = table->RowFlags;
    table->RowFlags = row_flags;
    table->RowCellPaddingY = g.Style.CellPadding.y;
    table->RowMinHeight = row_min_height;
    TableBeginRow(table);

    // We honor min_row_height requested by user, but cannot guarantee per-row maximum height,
    // because that would essentially require a unique clipping rectangle per-cell.
    table->RowPosY2 += table->RowCellPaddingY * 2.0f;
    table->RowPosY2 = ImMax(table->RowPosY2, table->RowPosY1 + row_min_height);

    // Disable output until user calls TableNextColumn()
    table->InnerWindow->SkipItems = true;
}